

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

NullableValue<kj::HttpServer::SuspendedRequest> * __thiscall
kj::_::NullableValue<kj::HttpServer::SuspendedRequest>::operator=
          (NullableValue<kj::HttpServer::SuspendedRequest> *this,
          NullableValue<kj::HttpServer::SuspendedRequest> *other)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      HttpHeaders::~HttpHeaders(&(this->field_1).value.headers);
      if ((this->field_1).value.method.tag == 1) {
        (this->field_1).value.method.tag = 0;
      }
      if ((this->field_1).value.method.tag == 2) {
        (this->field_1).value.method.tag = 0;
      }
      puVar1 = (this->field_1).value.buffer.ptr;
      if (puVar1 != (uchar *)0x0) {
        sVar2 = (this->field_1).value.buffer.size_;
        (this->field_1).value.buffer.ptr = (uchar *)0x0;
        (this->field_1).value.buffer.size_ = 0;
        pAVar3 = (this->field_1).value.buffer.disposer;
        (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,1,sVar2,sVar2,0);
      }
    }
    if (other->isSet == true) {
      (this->field_1).value.buffer.ptr = (other->field_1).value.buffer.ptr;
      (this->field_1).value.buffer.size_ = (other->field_1).value.buffer.size_;
      (this->field_1).value.buffer.disposer = (other->field_1).value.buffer.disposer;
      (other->field_1).value.buffer.ptr = (uchar *)0x0;
      (other->field_1).value.buffer.size_ = 0;
      sVar2 = (other->field_1).value.leftover.size_;
      (this->field_1).value.leftover.ptr = (other->field_1).value.leftover.ptr;
      (this->field_1).value.leftover.size_ = sVar2;
      (this->field_1).value.method.tag = (other->field_1).value.method.tag;
      if ((other->field_1).value.method.tag == 1) {
        *(undefined4 *)&(this->field_1).value.method.field_1 =
             *(undefined4 *)&(other->field_1).value.method.field_1;
      }
      sVar2 = (other->field_1).value.url.content.size_;
      (this->field_1).value.url.content.ptr = (other->field_1).value.url.content.ptr;
      (this->field_1).value.url.content.size_ = sVar2;
      HttpHeaders::HttpHeaders(&(this->field_1).value.headers,&(other->field_1).value.headers);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }